

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O0

long UnifInt(long nLow,long nHigh,long nStream)

{
  long lVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long nTemp;
  double dRange;
  long local_18;
  long local_10;
  long local_8;
  
  if ((in_RDX < 0) || (local_18 = in_RDX, 0x31 < in_RDX)) {
    local_18 = 0;
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RSI < in_RDI) {
    local_10 = in_RDI;
    local_8 = in_RSI;
  }
  lVar1 = NextRand(Seed[local_18].value);
  Seed[local_18].value = lVar1;
  return local_8 + (long)(((double)Seed[local_18].value / dM) * (double)((local_10 - local_8) + 1));
}

Assistant:

long
UnifInt(long nLow, long nHigh, long nStream)

/*
 * Returns an integer uniformly distributed between nLow and nHigh, 
 * including * the endpoints.  nStream is the random number stream.   
 * Stream 0 is used if nStream is not in the range 0..MAX_STREAM.
 */

{
    double          dRange;
    long            nTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;

    if (nLow > nHigh)
    {
        nTemp = nLow;
        nLow = nHigh;
        nHigh = nTemp;
    }

    dRange = (double) (nHigh - nLow + 1);
    Seed[nStream].value = NextRand(Seed[nStream].value);
    nTemp = (long) (((double) Seed[nStream].value / dM) * (dRange));
    return (nLow + nTemp);
}